

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# STACK.h
# Opt level: O2

bool __thiscall STACK<int>::pop(STACK<int> *this)

{
  NODE<int>_conflict *pNVar1;
  NODE<int>_conflict *p;
  
  pNVar1 = this->m_pHead;
  if (pNVar1 != (NODE<int>_conflict *)0x0) {
    if (pNVar1 == this->m_pTail) {
      this->m_pHead = (NODE<int>_conflict *)0x0;
      this->m_pTail = (NODE<int>_conflict *)0x0;
    }
    else {
      this->m_pHead = pNVar1->pNext;
    }
    operator_delete(pNVar1);
  }
  return pNVar1 != (NODE<int>_conflict *)0x0;
}

Assistant:

inline bool STACK<T>::pop()
{
	T x;
	if (m_pHead == NULL)
	{
		return false;
	}
	if (m_pHead == m_pTail) {
		NODE<T> *p = m_pHead;
		m_pHead = m_pTail = NULL;
		delete p;
		return true;
	}
	else {
		NODE<T> *p = m_pHead;
		m_pHead = m_pHead->pNext;
		delete p;
		return true;
	}
}